

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

vector<std::reference_wrapper<duckdb::SecretStorage>,_true> * __thiscall
duckdb::SecretManager::GetSecretStorages
          (vector<std::reference_wrapper<duckdb::SecretStorage>,_true> *__return_storage_ptr__,
          SecretManager *this)

{
  type in_RAX;
  __node_base *p_Var1;
  reference_wrapper<duckdb::SecretStorage> local_28;
  
  local_28._M_data = in_RAX;
  ::std::mutex::lock(&this->manager_lock);
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->secret_storages)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    local_28._M_data =
         unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>::
         operator*((unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>
                    *)(p_Var1 + 5));
    ::std::
    vector<std::reference_wrapper<duckdb::SecretStorage>,std::allocator<std::reference_wrapper<duckdb::SecretStorage>>>
    ::emplace_back<std::reference_wrapper<duckdb::SecretStorage>>
              ((vector<std::reference_wrapper<duckdb::SecretStorage>,std::allocator<std::reference_wrapper<duckdb::SecretStorage>>>
                *)__return_storage_ptr__,&local_28);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->manager_lock);
  return __return_storage_ptr__;
}

Assistant:

vector<reference<SecretStorage>> SecretManager::GetSecretStorages() {
	lock_guard<mutex> lock(manager_lock);

	vector<reference<SecretStorage>> result;

	for (const auto &storage : secret_storages) {
		result.push_back(*storage.second);
	}

	return result;
}